

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayNewData
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          ArrayNewData *curr)

{
  char **x;
  uint uVar1;
  ulong uVar2;
  size_t reservedSize;
  long lVar3;
  size_type sVar4;
  ulong uVar5;
  Name NVar6;
  undefined1 local_168 [8];
  Flow offsetFlow;
  Flow sizeFlow;
  HeapType heapType;
  Literals contents;
  undefined8 local_68;
  undefined8 local_60;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_168,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x20));
  if (offsetFlow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&offsetFlow.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x28));
    if (sizeFlow.breakTo.super_IString.str._M_len == 0) {
      Flow::getSingleValue((Flow *)local_168);
      uVar2 = wasm::Literal::getUnsigned();
      Flow::getSingleValue((Flow *)&offsetFlow.breakTo.super_IString.str._M_str);
      reservedSize = wasm::Literal::getUnsigned();
      Type::getHeapType((Type *)(curr + 8));
      wasm::HeapType::getArray();
      contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
      str._M_str = (char *)0x0;
      contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      heapType.id = 0;
      contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      NVar6.super_IString.str._M_str = *(char **)(curr + 0x10);
      NVar6.super_IString.str._M_len = (size_t)this->wasm;
      lVar3 = wasm::Module::getDataSegment(NVar6);
      uVar1 = wasm::Field::getByteSize();
      uVar5 = uVar1 * reservedSize + uVar2;
      if ((CARRY8(uVar1 * reservedSize,uVar2)) ||
         ((ulong)(*(long *)(lVar3 + 0x40) - *(long *)(lVar3 + 0x38)) < uVar5)) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"out of bounds segment access in array.new_data");
      }
      sVar4 = std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(&(this->droppedDataSegments)._M_h,(key_type *)(curr + 0x10));
      if ((uVar5 != 0) && (sVar4 != 0)) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"dropped segment access in array.new_data");
      }
      SmallVector<wasm::Literal,_1UL>::reserve
                ((SmallVector<wasm::Literal,_1UL> *)&heapType,reservedSize);
      x = &sizeFlow.breakTo.super_IString.str._M_str;
      for (; (uVar2 & 0xffffffff) < uVar5; uVar2 = (ulong)((int)uVar2 + uVar1)) {
        ExpressionRunner<wasm::ModuleRunner>::makeFromMemory
                  (x,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                   *(long *)(lVar3 + 0x38) + (uVar2 & 0xffffffff),local_68,local_60);
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)&heapType,(Literal *)x);
        wasm::Literal::~Literal((Literal *)x);
      }
      ExpressionRunner<wasm::ModuleRunner>::makeGCData
                ((Literal *)
                 &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,(Literals *)&heapType,
                 (Type)*(uintptr_t *)(curr + 8));
      Flow::Flow(__return_storage_ptr__,
                 (Literal *)
                 &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      wasm::Literal::~Literal
                ((Literal *)
                 &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&heapType);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&offsetFlow.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&offsetFlow.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_168);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_168);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewData(ArrayNewData* curr) {
    NOTE_ENTER("ArrayNewData");
    auto offsetFlow = self()->visit(curr->offset);
    if (offsetFlow.breaking()) {
      return offsetFlow;
    }
    auto sizeFlow = self()->visit(curr->size);
    if (sizeFlow.breaking()) {
      return sizeFlow;
    }

    uint64_t offset = offsetFlow.getSingleValue().getUnsigned();
    uint64_t size = sizeFlow.getSingleValue().getUnsigned();

    auto heapType = curr->type.getHeapType();
    const auto& element = heapType.getArray().element;
    Literals contents;

    const auto& seg = *wasm.getDataSegment(curr->segment);
    auto elemBytes = element.getByteSize();

#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"

    uint64_t end;
    if (std::ckd_add(&end, offset, size * elemBytes) || end > seg.data.size()) {
      trap("out of bounds segment access in array.new_data");
    }
    if (droppedDataSegments.count(curr->segment) && end > 0) {
      trap("dropped segment access in array.new_data");
    }
    contents.reserve(size);
    for (Index i = offset; i < end; i += elemBytes) {
      auto addr = (void*)&seg.data[i];
      contents.push_back(this->makeFromMemory(addr, element));
    }

#pragma GCC diagnostic pop

    return self()->makeGCData(std::move(contents), curr->type);
  }